

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O2

void doitz(bool skipheader)

{
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar1;
  undefined7 in_register_00000039;
  VulnerabilityIndex idx;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("vulnerability_id,intensity_bin_id,damage_bin_id,probability");
  }
  __stream = fopen("vulnerability.bin.z","rb");
  __stream_00 = fopen("vulnerability.idx.z","rb");
  if (__stream_00 != (FILE *)0x0) {
    while( true ) {
      sVar1 = fread(&idx,0x1c,1,__stream_00);
      if (sVar1 == 0) break;
      fseek(__stream,idx.offset,0);
      printrowsz(idx.vulnerability_id,(FILE *)__stream,idx.size,idx.original_size);
    }
    fclose(__stream);
    fclose(__stream_00);
    return;
  }
  fwrite("FATAL: Vulnerability idx open failed\n",0x25,1,_stderr);
  exit(1);
}

Assistant:

void doitz(bool skipheader)
{

	if (skipheader == false) {
		printf("vulnerability_id,intensity_bin_id,damage_bin_id,"
		       "probability\n");
	}

	const char *binFileName = "vulnerability.bin.z";
	const char *idxFileName = "vulnerability.idx.z";
	FILE *finx = fopen(binFileName, "rb");
	FILE *finy = fopen(idxFileName, "rb");
	if (finy == nullptr) {
		fprintf(stderr, "FATAL: Vulnerability idx open failed\n");
		exit(EXIT_FAILURE);
	}

	VulnerabilityIndex idx;

	size_t i = fread(&idx, sizeof(idx), 1, finy);
	while (i != 0) {
		flseek(finx, idx.offset, SEEK_SET);
		printrowsz(idx.vulnerability_id, finx, idx.size,
			   idx.original_size);
		i = fread(&idx, sizeof(idx), 1, finy);
	}

	fclose(finx);
	fclose(finy);

}